

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchingFunction.cpp
# Opt level: O3

bool __thiscall
OpenMD::SwitchingFunction::getSwitch
          (SwitchingFunction *this,RealType *r2,RealType *sw,RealType *dswdr,RealType *r)

{
  double __x;
  bool bVar1;
  RealType RVar2;
  
  *sw = 1.0;
  *dswdr = 0.0;
  __x = *r2;
  if (this->rin2_ <= __x && __x != this->rin2_) {
    if (__x < this->rout2_ || __x == this->rout2_) {
      if (__x < 0.0) {
        RVar2 = sqrt(__x);
      }
      else {
        RVar2 = SQRT(__x);
      }
      *r = RVar2;
      CubicSpline::getValueAndDerivativeAt
                ((this->switchSpline_).
                 super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr,r,sw,
                 dswdr);
      bVar1 = true;
    }
    else {
      *sw = 0.0;
      bVar1 = false;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool SwitchingFunction::getSwitch(const RealType& r2, RealType& sw,
                                    RealType& dswdr, RealType& r) {
    sw    = 1.0;
    dswdr = 0.0;

    bool in_switching_region = false;

    if (r2 > rin2_) {
      if (r2 > rout2_) {
        sw = 0.0;
      } else {
        in_switching_region = true;
        r                   = sqrt(r2);
        switchSpline_->getValueAndDerivativeAt(r, sw, dswdr);
      }
    }
    return in_switching_region;
  }